

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::printDependencies(Sandbox *this,ShaderType _type)

{
  ostream *poVar1;
  pointer pbVar2;
  long lVar3;
  ulong uVar4;
  
  if (_type == FRAGMENT) {
    pbVar2 = (this->m_frag_dependencies).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_frag_dependencies).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)((long)pbVar2 + lVar3 + -8),
                            *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
        pbVar2 = (this->m_frag_dependencies).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < (ulong)((long)(this->m_frag_dependencies).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
              );
    }
  }
  else {
    pbVar2 = (this->m_vert_dependencies).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vert_dependencies).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)((long)pbVar2 + lVar3 + -8),
                            *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
        pbVar2 = (this->m_vert_dependencies).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < (ulong)((long)(this->m_vert_dependencies).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
              );
    }
  }
  return;
}

Assistant:

void Sandbox::printDependencies(ShaderType _type) const {
    if (_type == FRAGMENT)
        for (size_t i = 0; i < m_frag_dependencies.size(); i++)
            std::cout << m_frag_dependencies[i] << std::endl;
    
    else 
        for (size_t i = 0; i < m_vert_dependencies.size(); i++)
            std::cout << m_vert_dependencies[i] << std::endl;
}